

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildAsmCall
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,ArgSlot argCount,RegSlot ret,
          RegSlot function,int8 returnType,ProfileId profileId)

{
  OpCode OVar1;
  Opnd *this_00;
  code *pcVar2;
  IRType IVar3;
  bool bVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  ProfileId PVar5;
  RegSlot RVar6;
  int iVar7;
  int iVar8;
  RegOpnd *pRVar9;
  RegOpnd *pRVar10;
  ProfiledInstr *this_01;
  JITTimeFunctionBody *pJVar11;
  ProfiledInstr *pPVar12;
  ProfiledInstr *this_02;
  StackSym *pSVar13;
  IntConstOpnd *newSrc;
  undefined4 *puVar14;
  uint uVar15;
  undefined6 in_register_00000032;
  SList<int,_Memory::ArenaAllocator,_RealCount> *this_03;
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *this_04;
  
  iVar7 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (1 < iVar7 - 0x1dU) {
    if (iVar7 == 0x12) {
      RVar6 = GetRegSlotFromInt64Reg(this,function);
      pRVar9 = BuildSrcOpnd(this,RVar6,TyInt64);
      RVar6 = GetRegSlotFromInt64Reg(this,ret);
      pRVar10 = BuildDstOpnd(this,RVar6,TyInt64);
      this_01 = (ProfiledInstr *)
                IR::Instr::New(AsmJsCallE,&pRVar10->super_Opnd,&pRVar9->super_Opnd,this->m_func);
      iVar7 = 0;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x717,"((0))","(0)");
      if (!bVar4) goto LAB_004ba7ac;
      *puVar14 = 0;
      iVar7 = 0;
      this_01 = (ProfiledInstr *)0x0;
    }
    goto LAB_004ba51d;
  }
  RVar6 = GetRegSlotFromInt64Reg(this,function);
  pRVar9 = BuildSrcOpnd(this,RVar6,TyInt64);
  switch(returnType) {
  case '\x01':
    RVar6 = GetRegSlotFromInt64Reg(this,ret);
    IVar3 = TyInt64;
    goto LAB_004ba349;
  case '\x02':
    RVar6 = GetRegSlotFromDoubleReg(this,ret);
    IVar3 = TyFloat64;
    goto LAB_004ba31b;
  case '\x03':
    RVar6 = GetRegSlotFromFloatReg(this,ret);
    IVar3 = TyFloat32;
LAB_004ba31b:
    pRVar10 = BuildDstOpnd(this,RVar6,IVar3);
    valueType.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
    goto LAB_004ba363;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x6f8,"((0))","(0)");
    if (!bVar4) goto LAB_004ba7ac;
    *puVar14 = 0;
  case '\r':
    pRVar10 = (RegOpnd *)0x0;
    goto LAB_004ba39c;
  case '\n':
    RVar6 = GetRegSlotFromIntReg(this,ret);
    IVar3 = TyInt32;
LAB_004ba349:
    pRVar10 = BuildDstOpnd(this,RVar6,IVar3);
    valueType.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
LAB_004ba363:
    IR::Opnd::SetValueType(&pRVar10->super_Opnd,(ValueType)valueType.field_0);
    goto LAB_004ba39c;
  case '\x0e':
    RVar6 = GetRegSlotFromSimd128Reg(this,ret);
    IVar3 = TySimd128I4;
    break;
  case '\x0f':
    RVar6 = GetRegSlotFromSimd128Reg(this,ret);
    IVar3 = TySimd128U4;
    break;
  case '\x10':
    RVar6 = GetRegSlotFromSimd128Reg(this,ret);
    IVar3 = TySimd128I8;
    break;
  case '\x11':
    RVar6 = GetRegSlotFromSimd128Reg(this,ret);
    IVar3 = TySimd128I16;
    break;
  case '\x12':
    RVar6 = GetRegSlotFromSimd128Reg(this,ret);
    IVar3 = TySimd128U8;
    break;
  case '\x13':
    RVar6 = GetRegSlotFromSimd128Reg(this,ret);
    IVar3 = TySimd128U16;
    break;
  case '\x14':
    RVar6 = GetRegSlotFromSimd128Reg(this,ret);
    IVar3 = TySimd128B4;
    break;
  case '\x15':
    RVar6 = GetRegSlotFromSimd128Reg(this,ret);
    IVar3 = TySimd128B8;
    break;
  case '\x16':
    RVar6 = GetRegSlotFromSimd128Reg(this,ret);
    IVar3 = TySimd128B16;
    break;
  case '\x17':
    RVar6 = GetRegSlotFromSimd128Reg(this,ret);
    IVar3 = TySimd128F4;
    break;
  case '\x18':
    RVar6 = GetRegSlotFromSimd128Reg(this,ret);
    IVar3 = TySimd128D2;
  }
  pRVar10 = BuildDstOpnd(this,RVar6,IVar3);
LAB_004ba39c:
  if (profileId == 0xffff) {
    this_01 = (ProfiledInstr *)
              IR::Instr::New(AsmJsCallI,&pRVar10->super_Opnd,&pRVar9->super_Opnd,this->m_func);
  }
  else {
    if (newOpcode != ProfiledI_Call) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x702,"(newOpcode == Js::OpCodeAsmJs::ProfiledI_Call)",
                         "newOpcode == Js::OpCodeAsmJs::ProfiledI_Call");
      if (!bVar4) goto LAB_004ba7ac;
      *puVar14 = 0;
    }
    this_01 = IR::ProfiledInstr::New
                        (AsmJsCallI,&pRVar10->super_Opnd,&pRVar9->super_Opnd,this->m_func);
    pJVar11 = Func::GetJITFunctionBody(this->m_func);
    PVar5 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar11);
    if (PVar5 <= profileId) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x704,
                         "(profileId < m_func->GetJITFunctionBody()->GetProfiledCallSiteCount())",
                         "profileId < m_func->GetJITFunctionBody()->GetProfiledCallSiteCount()");
      if (!bVar4) goto LAB_004ba7ac;
      *puVar14 = 0;
    }
    pPVar12 = IR::Instr::AsProfiledInstr(&this_01->super_Instr);
    *(uint *)&pPVar12->u = (uint)profileId;
  }
  this_03 = this->m_argOffsetStack;
  if ((SList<int,_Memory::ArenaAllocator,_RealCount> *)
      (this_03->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this_03) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x708,"(!this->m_argOffsetStack->Empty())",
                       "!this->m_argOffsetStack->Empty()");
    if (!bVar4) goto LAB_004ba7ac;
    *puVar14 = 0;
    this_03 = this->m_argOffsetStack;
  }
  iVar7 = SList<int,_Memory::ArenaAllocator,_RealCount>::Pop(this_03);
  iVar7 = iVar7 + -8;
LAB_004ba51d:
  AddInstr(this,&this_01->super_Instr,offset);
  this_04 = &this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>;
  if ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
      (((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
       &this_04->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>)->
      super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this_04) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x71e,"(!this->m_argStack->Empty())","!this->m_argStack->Empty()");
    if (!bVar4) goto LAB_004ba7ac;
    *puVar14 = 0;
    this_04 = &this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>;
  }
  pPVar12 = (ProfiledInstr *)SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Pop(this_04);
  uVar15 = 0;
  while (this_02 = pPVar12, OVar1 = (this_02->super_Instr).m_opcode,
        (SListCounted<IR::Instr_*,_Memory::ArenaAllocator> *)
        (this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
        super_SListNodeBase<Memory::ArenaAllocator>.next != this->m_argStack) {
    if (OVar1 == StartCall) goto LAB_004ba667;
    if ((ushort)(newOpcode - I_Call) < 2) {
      this_00 = (this_02->super_Instr).m_dst;
      iVar8 = TySize[this_00->m_type];
      if (iVar8 < 9) {
        iVar8 = 8;
      }
      iVar7 = iVar7 - iVar8;
      pSVar13 = IR::Opnd::GetStackSym(this_00);
      pSVar13->m_offset = iVar7;
    }
    IR::Instr::SetSrc2(&this_01->super_Instr,(this_02->super_Instr).m_dst);
    uVar15 = uVar15 + 1;
    pPVar12 = (ProfiledInstr *)
              SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Pop
                        (&this->m_argStack->
                          super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
    this_01 = this_02;
  }
  if (OVar1 != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x733,"(argInstr->m_opcode == Js::OpCode::StartCall)",
                       "argInstr->m_opcode == Js::OpCode::StartCall");
    if (!bVar4) goto LAB_004ba7ac;
    *puVar14 = 0;
  }
LAB_004ba667:
  newSrc = IR::IntConstOpnd::New((ulong)(uVar15 & 0xffff),TyUint16,this->m_func,false);
  IR::Instr::SetSrc1(&this_02->super_Instr,&newSrc->super_Opnd);
  if (iVar7 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x736,"(argOffset == 0)","argOffset == 0");
    if (!bVar4) {
LAB_004ba7ac:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar14 = 0;
  }
  IR::Instr::SetSrc2(&this_01->super_Instr,(this_02->super_Instr).m_dst);
  if (this->m_func->m_argSlotsForFunctionsCalled < (uint)argCount) {
    this->m_func->m_argSlotsForFunctionsCalled = (uint)argCount;
  }
  bVar4 = AsmJsJITInfo::UsesHeapBuffer(this->m_asmFuncInfo);
  if (bVar4) {
    pJVar11 = Func::GetJITFunctionBody(this->m_func);
    bVar4 = JITTimeFunctionBody::IsWasmFunction(pJVar11);
    if (bVar4) {
      BuildHeapBufferReload(this,offset,false);
      return;
    }
  }
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildAsmCall(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::ArgSlot argCount, Js::RegSlot ret, Js::RegSlot function, int8 returnType, Js::ProfileId profileId)
{
    Js::ArgSlot count = 0;

    IR::Instr * instr = nullptr;
    IR::RegOpnd * dstOpnd = nullptr;
    IR::Opnd * srcOpnd = nullptr;
    Js::RegSlot dstRegSlot;
    Js::RegSlot srcRegSlot;
    int32 argOffset = 0;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::I_Call:
    case Js::OpCodeAsmJs::ProfiledI_Call:
        srcRegSlot = GetRegSlotFromPtrReg(function);
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyMachReg);

        switch ((Js::AsmJsRetType::Which)returnType)
        {
        case Js::AsmJsRetType::Which::Signed:
            dstRegSlot = GetRegSlotFromIntReg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
            dstOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Float:
            dstRegSlot = GetRegSlotFromFloatReg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat32);
            dstOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsRetType::Which::Double:
            dstRegSlot = GetRegSlotFromDoubleReg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat64);
            dstOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsRetType::Which::Int64:
            dstRegSlot = GetRegSlotFromInt64Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
            dstOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Void:
            break;

#ifdef ENABLE_WASM_SIMD
        case Js::AsmJsRetType::Which::Float32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128F4);
            break;
        case Js::AsmJsRetType::Which::Int32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I4);
            break;
        case Js::AsmJsRetType::Which::Bool32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128B4);
            break;
        case Js::AsmJsRetType::Which::Bool16x8:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128B8);
            break;
        case Js::AsmJsRetType::Which::Bool8x16:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128B16);
            break;
        case Js::AsmJsRetType::Which::Float64x2:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128D2);
            break;
        case Js::AsmJsRetType::Which::Int16x8:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I8);
            break;
        case Js::AsmJsRetType::Which::Int8x16:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I16);
            break;
        case Js::AsmJsRetType::Which::Uint32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U4);
            break;
        case Js::AsmJsRetType::Which::Uint16x8:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U8);
            break;
        case Js::AsmJsRetType::Which::Uint8x16:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U16);
            break;
#endif
        default:
            Assume(UNREACHED);
        }

        {
            if (profileId == Js::Constants::NoProfileId)
            {
                instr = IR::Instr::New(Js::OpCode::AsmJsCallI, dstOpnd, srcOpnd, m_func);
            }
            else
            {
                Assert(newOpcode == Js::OpCodeAsmJs::ProfiledI_Call);
                instr = IR::ProfiledInstr::New(Js::OpCode::AsmJsCallI, dstOpnd, srcOpnd, m_func);
                AssertOrFailFast(profileId < m_func->GetJITFunctionBody()->GetProfiledCallSiteCount());
                instr->AsProfiledInstr()->u.profileId = profileId;
            }
        }
        AssertOrFailFast(!this->m_argOffsetStack->Empty());
        argOffset = m_argOffsetStack->Pop();
        argOffset -= MachPtr;
        break;

    case Js::OpCodeAsmJs::Call:
        srcRegSlot = GetRegSlotFromPtrReg(function);
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyMachReg);

        dstRegSlot = GetRegSlotFromPtrReg(ret);
        dstOpnd = BuildDstOpnd(dstRegSlot, TyMachReg);

        instr = IR::Instr::New(Js::OpCode::AsmJsCallE, dstOpnd, srcOpnd, m_func);
        break;
    default:
        Assume(UNREACHED);
    }
    AddInstr(instr, offset);

    IR::Instr * argInstr = nullptr;
    IR::Instr * prevInstr = instr;

    AssertOrFailFast(!this->m_argStack->Empty());
    for (argInstr = m_argStack->Pop(); !m_argStack->Empty() && argInstr->m_opcode != Js::OpCode::StartCall; argInstr = m_argStack->Pop())
    {
        if (newOpcode == Js::OpCodeAsmJs::I_Call || newOpcode == Js::OpCodeAsmJs::ProfiledI_Call)
        {
#if _M_IX86
            argOffset -= argInstr->GetDst()->GetSize();
#elif _M_X64
            argOffset -= (argInstr->GetDst()->GetSize() <= MachPtr ? MachPtr : argInstr->GetDst()->GetSize());
#else
            Assert(UNREACHED);
#endif
            argInstr->GetDst()->GetStackSym()->m_offset = argOffset;

        }
        // associate the ArgOuts with this call via src2
        prevInstr->SetSrc2(argInstr->GetDst());
        prevInstr = argInstr;
        count++;
    }

    AssertOrFailFast(argInstr->m_opcode == Js::OpCode::StartCall);
    argInstr->SetSrc1(IR::IntConstOpnd::New(count, TyUint16, m_func));

    AssertOrFailFast(argOffset == 0);
    prevInstr->SetSrc2(argInstr->GetDst());

    // todo:: are we sure we don't need this for wasm ?
#ifdef ENABLE_SIMDJS
#if defined(_M_X64)
    // Without SIMD vars, all args are Var in size. So offset in Var = arg position in args list.
    // With SIMD, args have variable size, so we need to track argument position in the args list to be able to assign arg register for first four args on x64.
    if (m_func->IsSIMDEnabled())
    {
        for (uint i = 1; !m_tempList->Empty(); i++)
        {
            IR::Instr * instrArg = m_tempList->Pop();
            // record argument position and make room for implicit args
            instrArg->GetDst()->GetStackSym()->m_argPosition = i;
            if (newOpcode == Js::OpCodeAsmJs::I_Call || newOpcode == Js::OpCodeAsmJs::ProfiledI_Call)
            {
                // implicit func obj arg
                instrArg->GetDst()->GetStackSym()->m_argPosition += 1;
            }
            else
            {
                // implicit func obj + callInfo args
                Assert(newOpcode == Js::OpCodeAsmJs::Call);
                instrArg->GetDst()->GetStackSym()->m_argPosition += 2;
            }
        }
    }
#endif
#endif
    if (m_func->m_argSlotsForFunctionsCalled < argCount)
    {
        m_func->m_argSlotsForFunctionsCalled = argCount;
    }
#ifdef ENABLE_WASM
    // heap buffer can change for wasm
    if (m_asmFuncInfo->UsesHeapBuffer() && m_func->GetJITFunctionBody()->IsWasmFunction())
    {
        BuildHeapBufferReload(offset);
    }
#endif
}